

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

vm_obj_id_t CVmObjList::create(int in_root_set,char *lst)

{
  ushort uVar1;
  vm_obj_id_t obj_id;
  CVmObjList *this;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,1,0);
  this = (CVmObjList *)CVmObject::operator_new(0x10,obj_id);
  (this->super_CVmObjCollection).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_0034a290;
  uVar1 = *(ushort *)lst;
  alloc_list(this,(ulong)uVar1);
  memcpy((this->super_CVmObjCollection).super_CVmObject.ext_,lst,(ulong)uVar1 * 5 + 2);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjList::create(VMG_ int in_root_set, const char *lst)
{
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, TRUE, FALSE);
    new (vmg_ id) CVmObjList(vmg_ lst);
    return id;
}